

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivate::updateViewContainerPaletteAndOpacity(QComboBoxPrivate *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QComboBox *this_00;
  QStyle *pQVar4;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QComboBox *q;
  QMenu menu;
  QStyleOptionComboBox opt;
  QWidget *in_stack_ffffffffffffff08;
  QStyleOptionComboBox *in_stack_ffffffffffffff10;
  QComboBoxPrivateContainer *in_stack_ffffffffffffff20;
  QComboBoxPrivate *this_01;
  QWidget *in_stack_ffffffffffffff40;
  undefined1 local_98 [48];
  qreal in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QComboBoxPrivateContainer> *)0x535947);
  if (bVar2) {
    this_00 = q_func(in_RDI);
    memset(local_98,0xaa,0x90);
    QStyleOptionComboBox::QStyleOptionComboBox((QStyleOptionComboBox *)0x53597d);
    (**(code **)(*(long *)&this_00->super_QWidget + 0x1b8))(this_00,local_98);
    pQVar4 = QWidget::style(in_stack_ffffffffffffff08);
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x19,local_98,this_00,0);
    if (iVar3 == 0) {
      in_stack_ffffffffffffff10 =
           (QStyleOptionComboBox *)
           QPointer<QComboBoxPrivateContainer>::operator->
                     ((QPointer<QComboBoxPrivateContainer> *)0x535a61);
      QWidget::palette((QWidget *)in_stack_ffffffffffffff10);
      QWidget::setPalette((QWidget *)in_RDI,(QPalette *)in_stack_ffffffffffffff20);
      QPointer<QComboBoxPrivateContainer>::operator->
                ((QPointer<QComboBoxPrivateContainer> *)0x535a8e);
      QWidget::setWindowOpacity(in_stack_ffffffffffffff40,in_stack_ffffffffffffff98);
    }
    else {
      memset(&stack0xffffffffffffff40,0xaa,0x28);
      QMenu::QMenu((QMenu *)this_00,(QWidget *)in_RDI);
      QWidget::ensurePolished((QWidget *)this_01);
      QPointer<QComboBoxPrivateContainer>::operator->
                ((QPointer<QComboBoxPrivateContainer> *)0x5359fe);
      QWidget::palette((QWidget *)in_stack_ffffffffffffff10);
      QWidget::setPalette((QWidget *)in_RDI,(QPalette *)in_stack_ffffffffffffff20);
      in_stack_ffffffffffffff20 =
           QPointer<QComboBoxPrivateContainer>::operator->
                     ((QPointer<QComboBoxPrivateContainer> *)0x535a2b);
      QWidget::windowOpacity((QWidget *)in_stack_ffffffffffffff20);
      QWidget::setWindowOpacity(in_stack_ffffffffffffff40,in_stack_ffffffffffffff98);
      QMenu::~QMenu((QMenu *)in_RDI);
    }
    if (in_RDI->lineEdit != (QLineEdit *)0x0) {
      QWidget::palette((QWidget *)in_stack_ffffffffffffff10);
      QWidget::setPalette((QWidget *)in_RDI,(QPalette *)in_stack_ffffffffffffff20);
    }
    QStyleOptionComboBox::~QStyleOptionComboBox(in_stack_ffffffffffffff10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::updateViewContainerPaletteAndOpacity()
{
    if (!container)
        return;
    Q_Q(QComboBox);
    QStyleOptionComboBox opt;
    q->initStyleOption(&opt);
#if QT_CONFIG(menu)
    if (q->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, q)) {
        QMenu menu;
        menu.ensurePolished();
        container->setPalette(menu.palette());
        container->setWindowOpacity(menu.windowOpacity());
    } else
#endif
    {
        container->setPalette(q->palette());
        container->setWindowOpacity(1.0);
    }
    if (lineEdit)
        lineEdit->setPalette(q->palette());
}